

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printStats(JSPrinter *this,Ref stats)

{
  Ref node;
  size_t sVar1;
  bool bVar2;
  undefined8 *puVar3;
  bool bVar4;
  ulong uVar5;
  Value *local_38;
  Ref stats_local;
  
  local_38 = stats.inst;
  if ((stats.inst)->type == Array) {
    bVar4 = true;
    uVar5 = 0;
    do {
      if ((((local_38->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements <= uVar5) {
        return;
      }
      puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
      node.inst = (Value *)*puVar3;
      bVar2 = isNothing(this,node);
      if (!bVar2) {
        if (bVar4) {
          bVar4 = false;
        }
        else {
          newline(this);
        }
        print(this,node);
        bVar2 = isDefun(this,node);
        if (!bVar2) {
          bVar2 = endsInBlock(this,node);
          if (!bVar2) {
            bVar2 = isIf(this,node);
            if (!bVar2) {
              maybeSpace(this,';');
              ensure(this,1);
              sVar1 = this->used;
              this->used = sVar1 + 1;
              this->buffer[sVar1] = ';';
            }
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while (local_38->type == Array);
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x199,"size_t cashew::Value::size()");
}

Assistant:

void printStats(Ref stats) {
    bool first = true;
    for (size_t i = 0; i < stats->size(); i++) {
      Ref curr = stats[i];
      if (!isNothing(curr)) {
        if (first) {
          first = false;
        } else {
          newline();
        }
        print(curr);
        if (!isDefun(curr) && !endsInBlock(curr) && !isIf(curr)) {
          emit(';');
        }
      }
    }
  }